

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O3

spv_result_t
spvTextEncodeOperand
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_operand_type_t type,char *textValue
          ,spv_instruction_t *pInst,spv_operand_pattern_t *pExpectedOperands)

{
  char cVar1;
  Op OVar2;
  pointer psVar3;
  pointer psVar4;
  iterator __position;
  iterator iVar5;
  pointer puVar6;
  undefined1 auVar7 [12];
  bool bVar8;
  spv_result_t sVar9;
  int iVar10;
  spv_result_t sVar11;
  spv_ext_inst_type_t sVar12;
  uint32_t uVar13;
  size_t name_len;
  char *pcVar14;
  DiagnosticStream *pDVar15;
  IdType *type_00;
  long lVar16;
  char **val;
  spv_operand_type_t *psVar17;
  uint32_t value;
  spv_operand_desc entry;
  char *opcode_name;
  IdType expected_type;
  char *local_250;
  undefined8 local_248;
  spv_literal_t local_240;
  char *local_210;
  undefined1 local_208 [8];
  pointer psStack_200;
  pointer local_1f8;
  spv_result_t local_38;
  
  local_250 = textValue;
  if (*textValue == '!') {
    sVar9 = anon_unknown.dwarf_1f56b9::encodeImmediate(context,textValue,pInst);
    if (sVar9 != SPV_SUCCESS) {
      return sVar9;
    }
    spvAlternatePatternFollowingImmediate((spv_operand_pattern_t *)local_208,pExpectedOperands);
    psVar3 = (pExpectedOperands->
             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
             super__Vector_impl_data._M_start;
    psVar4 = (pExpectedOperands->
             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (pExpectedOperands->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_208;
    (pExpectedOperands->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)
    ._M_impl.super__Vector_impl_data._M_finish = psStack_200;
    (pExpectedOperands->super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_1f8;
    local_208 = (undefined1  [8])0x0;
    psStack_200 = (pointer)0x0;
    local_1f8 = (pointer)0x0;
    if (psVar3 == (pointer)0x0) {
      return SPV_SUCCESS;
    }
    operator_delete(psVar3,(long)psVar4 - (long)psVar3);
    if (local_208 == (undefined1  [8])0x0) {
      return SPV_SUCCESS;
    }
    operator_delete((void *)local_208,(long)local_1f8 - (long)local_208);
    return SPV_SUCCESS;
  }
  bVar8 = spvOperandIsOptional(type);
  if (0x3c < type - SPV_OPERAND_TYPE_ID) {
    if ((type == SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS) ||
       (type == SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS))
    goto switchD_00181b72_caseD_23;
switchD_00181b72_caseD_c:
    name_len = strlen(textValue);
    sVar9 = spvtools::AssemblyGrammar::lookupOperand
                      (grammar,type,textValue,name_len,(spv_operand_desc *)&local_240);
    if (sVar9 == SPV_SUCCESS) {
      sVar9 = spvtools::AssemblyContext::binaryEncodeU32(context,*(Op *)(local_240._0_8_ + 8),pInst)
      ;
      if (sVar9 == SPV_SUCCESS) {
        psVar17 = (spv_operand_type_t *)(local_240._0_8_ + 0x1c + 0xc);
LAB_00182457:
        spvPushOperandTypes(psVar17,pExpectedOperands);
        return SPV_SUCCESS;
      }
    }
    spvtools::AssemblyContext::diagnostic
              ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Invalid ",8);
    pcVar14 = spvOperandTypeStr(type);
    val = (char **)&local_248;
LAB_001820df:
    *val = pcVar14;
    pDVar15 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,val);
    pcVar14 = " \'";
    lVar16 = 2;
LAB_001820f9:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar15,pcVar14,lVar16);
LAB_00182109:
    pDVar15 = spvtools::DiagnosticStream::operator<<(pDVar15,&local_250);
    pcVar14 = "\'.";
    lVar16 = 2;
LAB_0018211d:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar15,pcVar14,lVar16);
    local_38 = pDVar15->error_;
    goto LAB_0018212c;
  }
  sVar9 = (uint)bVar8 + (uint)bVar8 * 8 + SPV_ERROR_INVALID_TEXT;
  switch(type) {
  case SPV_OPERAND_TYPE_ID:
  case SPV_OPERAND_TYPE_TYPE_ID:
  case SPV_OPERAND_TYPE_RESULT_ID:
  case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
  case SPV_OPERAND_TYPE_SCOPE_ID:
  case SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE:
    if (*textValue != '%') {
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
      pcVar14 = "Expected id to start with %.";
      lVar16 = 0x1c;
LAB_00181cd4:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar14,lVar16);
      goto LAB_0018212c;
    }
    pcVar14 = textValue + 1;
    lVar16 = 0;
    local_250 = pcVar14;
LAB_00181c5b:
    cVar1 = pcVar14[lVar16];
    if (cVar1 == '_') {
LAB_00181c7d:
      lVar16 = lVar16 + 1;
      goto LAB_00181c5b;
    }
    if (cVar1 != '\0') {
      iVar10 = isalnum((int)cVar1);
      if (iVar10 == 0) goto LAB_00181f1d;
      goto LAB_00181c7d;
    }
    if (lVar16 != 0) {
      uVar13 = spvtools::AssemblyContext::spvNamedIdAssignOrGet(context,pcVar14);
      if (type == SPV_OPERAND_TYPE_TYPE_ID) {
        pInst->resultTypeId = uVar13;
      }
      local_208._0_4_ = uVar13;
      __position._M_current =
           (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pInst->words,__position,
                   (uint *)local_208);
      }
      else {
        *__position._M_current = uVar13;
        (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      bVar8 = spvIsExtendedInstruction(pInst->opcode);
      if (!bVar8) {
        return SPV_SUCCESS;
      }
      puVar6 = (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 != 0x10) {
        return SPV_SUCCESS;
      }
      sVar12 = spvtools::AssemblyContext::getExtInstTypeForId(context,puVar6[3]);
      if (sVar12 != SPV_EXT_INST_TYPE_NONE) {
        pInst->extInstType = sVar12;
        return SPV_SUCCESS;
      }
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Invalid extended instruction import Id ",0x27);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      goto LAB_0018212c;
    }
LAB_00181f1d:
    spvtools::AssemblyContext::diagnostic
              ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
    pcVar14 = "Invalid ID ";
    lVar16 = 0xb;
    break;
  case SPV_OPERAND_TYPE_LITERAL_INTEGER:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER:
    psStack_200 = (pointer)CONCAT44(psStack_200._4_4_,1);
    goto LAB_00182145;
  case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER:
    sVar9 = spvtools::AssemblyGrammar::lookupExtInst
                      (grammar,pInst->extInstType,textValue,(spv_ext_inst_desc *)&local_248);
    if (sVar9 == SPV_SUCCESS) {
      spvInstructionAddWord(pInst,*(uint32_t *)(CONCAT44(local_248._4_4_,(Op)local_248) + 8));
      psVar17 = (spv_operand_type_t *)(CONCAT44(local_248._4_4_,(Op)local_248) + 0x18);
      goto LAB_00182457;
    }
    bVar8 = spvExtInstIsNonSemantic(pInst->extInstType);
    if (bVar8) {
      local_240.str._M_string_length = 0;
      local_240.str.field_2._M_local_buf[0] = '\0';
      local_240.str._M_dataplus._M_p = (pointer)((long)&local_240 + 0x20U);
      sVar9 = spvTextToLiteral(local_250,&local_240);
      if (local_240.type != SPV_LITERAL_TYPE_UINT_32 || sVar9 != SPV_SUCCESS) {
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Couldn\'t translate unknown extended instruction name \'",
                   0x36);
        pDVar15 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_250);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar15,"\' to unsigned integer.",0x16);
        context = (AssemblyContext *)(ulong)(uint)pDVar15->error_;
        spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      }
      else {
        spvInstructionAddWord(pInst,local_240.value.u32);
        local_208._0_4_ = 0x34;
        iVar5._M_current =
             (pExpectedOperands->
             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar5._M_current ==
            (pExpectedOperands->
            super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
          _M_realloc_insert<spv_operand_type_t>
                    (pExpectedOperands,iVar5,(spv_operand_type_t *)local_208);
        }
        else {
          *iVar5._M_current = SPV_OPERAND_TYPE_FIRST_VARIABLE_TYPE;
          (pExpectedOperands->
          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
      }
      if (local_240.str._M_dataplus._M_p != (pointer)((long)&local_240 + 0x20U)) {
        operator_delete(local_240.str._M_dataplus._M_p,
                        CONCAT71(local_240.str.field_2._M_allocated_capacity._1_7_,
                                 local_240.str.field_2._M_local_buf[0]) + 1);
      }
      if (local_240.type == SPV_LITERAL_TYPE_UINT_32 && sVar9 == SPV_SUCCESS) {
        return SPV_SUCCESS;
      }
      return (spv_result_t)context;
    }
    pDVar15 = (DiagnosticStream *)local_208;
    spvtools::AssemblyContext::diagnostic(pDVar15,context,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar15,"Invalid extended instruction name \'",0x23);
    goto LAB_00182109;
  case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER:
    sVar9 = spvtools::AssemblyGrammar::lookupSpecConstantOpcode(grammar,textValue,(Op *)&local_248);
    if (sVar9 == SPV_SUCCESS) {
      auVar7._4_8_ = 0;
      auVar7._0_4_ = local_240.value.u32;
      local_240._0_12_ = auVar7 << 0x40;
      sVar9 = spvtools::AssemblyGrammar::lookupOpcode
                        (grammar,(Op)local_248,(spv_opcode_desc *)&local_240);
      if (sVar9 == SPV_SUCCESS) {
        spvInstructionAddWord(pInst,*(Op *)(local_240._0_8_ + 8));
        if (*(bool *)(local_240._0_8_ + 0x5d) == false) {
          __assert_fail("opcodeEntry->hasType",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                        ,0x128,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        if (*(bool *)(local_240._0_8_ + 0x5c) == false) {
          __assert_fail("opcodeEntry->hasResult",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                        ,0x129,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        if ((ushort)*(uint32_t *)(local_240._0_8_ + 0x18) < 2) {
          __assert_fail("opcodeEntry->numTypes >= 2",
                        "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                        ,0x12a,
                        "spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, const spv_operand_type_t, const char *, spv_instruction_t *, spv_operand_pattern_t *)"
                       );
        }
        psVar17 = (spv_operand_type_t *)(local_240._0_8_ + 0x1c + 8);
        goto LAB_00182457;
      }
      spvtools::AssemblyContext::diagnostic
                ((DiagnosticStream *)local_208,context,SPV_ERROR_INTERNAL);
      pcVar14 = "OpSpecConstant opcode table out of sync";
      lVar16 = 0x27;
      goto LAB_00181cd4;
    }
    spvtools::AssemblyContext::diagnostic
              ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Invalid ",8);
    pcVar14 = spvOperandTypeStr(SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER);
    val = (char **)&local_240;
    goto LAB_001820df;
  case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER:
  case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    local_240._0_12_ = ZEXT812(0);
    OVar2 = pInst->opcode;
    if (OVar2 != OpConstant) {
      if (OVar2 == OpSwitch) {
        local_240._0_12_ =
             spvtools::AssemblyContext::getTypeOfValueInstruction
                       (context,(pInst->words).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[1]);
        if (local_240.value._0_4_ != kScalarIntegerType) {
          spvtools::AssemblyContext::diagnostic
                    ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
          pcVar14 = 
          "The selector operand for OpSwitch must be the result of an instruction that generates an integer scalar"
          ;
          lVar16 = 0x67;
          goto LAB_00181cd4;
        }
      }
      else if (OVar2 == OpSpecConstant) goto LAB_00181dae;
LAB_001821a4:
      type_00 = (IdType *)&local_240;
      goto LAB_001821b5;
    }
LAB_00181dae:
    local_240._0_12_ =
         spvtools::AssemblyContext::getTypeOfTypeGeneratingValue(context,pInst->resultTypeId);
    if (local_240.value._0_4_ - kScalarIntegerType < 2) goto LAB_001821a4;
    local_210 = "opcode";
    sVar9 = spvtools::AssemblyGrammar::lookupOpcode
                      (grammar,pInst->opcode,(spv_opcode_desc *)&local_248);
    if (sVar9 == SPV_SUCCESS) {
      local_210 = *(char **)CONCAT44(local_248._4_4_,(Op)local_248);
    }
    spvtools::AssemblyContext::diagnostic
              ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Type for ",9);
    pDVar15 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_210);
    pcVar14 = " must be a scalar floating point or integer type";
    lVar16 = 0x30;
    goto LAB_0018211d;
  case SPV_OPERAND_TYPE_LITERAL_FLOAT:
    psStack_200 = (pointer)CONCAT44(psStack_200._4_4_,2);
LAB_00182145:
    type_00 = (IdType *)local_208;
    local_208 = (undefined1  [8])0x20;
LAB_001821b5:
    sVar9 = spvtools::AssemblyContext::binaryEncodeNumericLiteral
                      (context,textValue,sVar9,type_00,pInst);
    if (sVar9 == SPV_SUCCESS) {
      return SPV_SUCCESS;
    }
    return sVar9;
  case SPV_OPERAND_TYPE_LITERAL_STRING:
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING:
    bVar8 = false;
    local_240._0_8_ = local_240._4_8_ << 0x20;
    local_240.value.i32 = 0;
    local_240.str._M_string_length = 0;
    local_240.str.field_2._M_local_buf[0] = '\0';
    local_240.str._M_dataplus._M_p = (pointer)((long)&local_240 + 0x20U);
    sVar11 = spvTextToLiteral(textValue,&local_240);
    if (sVar11 == SPV_ERROR_OUT_OF_MEMORY) goto LAB_0018230d;
    if (sVar11 == SPV_SUCCESS) {
      if (local_240.type != SPV_LITERAL_TYPE_STRING) {
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
        pcVar14 = "Expected literal string, found literal number \'";
        lVar16 = 0x2f;
        goto LAB_001822d0;
      }
      if (pInst->opcode != OpExtInstImport) {
LAB_0018238d:
        sVar9 = spvtools::AssemblyContext::binaryEncodeString
                          (context,local_240.str._M_dataplus._M_p,pInst);
        bVar8 = sVar9 == SPV_SUCCESS;
        sVar11 = (uint)bVar8 * 5 + SPV_ERROR_INVALID_TEXT;
        goto LAB_0018230d;
      }
      sVar12 = spvExtInstImportTypeGet(local_240.str._M_dataplus._M_p);
      if (sVar12 == SPV_EXT_INST_TYPE_NONE) {
        spvtools::AssemblyContext::diagnostic
                  ((DiagnosticStream *)local_208,context,SPV_ERROR_INVALID_TEXT);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Invalid extended instruction import \'",0x25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_240.str._M_dataplus._M_p,
                   local_240.str._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\'",1);
        sVar11 = local_38;
        goto LAB_00182303;
      }
      sVar11 = spvtools::AssemblyContext::recordIdAsExtInstImport
                         (context,(pInst->words).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[1],sVar12);
      if (sVar11 == SPV_SUCCESS) goto LAB_0018238d;
    }
    else {
      spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_208,context,sVar9);
      pcVar14 = "Invalid literal string \'";
      lVar16 = 0x18;
LAB_001822d0:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar14,lVar16);
      pDVar15 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_250);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar15,"\'.",2);
      sVar11 = pDVar15->error_;
LAB_00182303:
      spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    }
    bVar8 = false;
LAB_0018230d:
    if (local_240.str._M_dataplus._M_p != (pointer)((long)&local_240 + 0x20U)) {
      operator_delete(local_240.str._M_dataplus._M_p,
                      CONCAT71(local_240.str.field_2._M_allocated_capacity._1_7_,
                               local_240.str.field_2._M_local_buf[0]) + 1);
    }
    if (bVar8) {
      return SPV_SUCCESS;
    }
    return sVar11;
  default:
    goto switchD_00181b72_caseD_c;
  case SPV_OPERAND_TYPE_IMAGE:
  case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
  case SPV_OPERAND_TYPE_SELECTION_CONTROL:
  case SPV_OPERAND_TYPE_LOOP_CONTROL:
  case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
  case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
  case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
  case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
  case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
switchD_00181b72_caseD_23:
    sVar9 = spvtools::AssemblyGrammar::parseMaskOperand
                      (grammar,type,textValue,(uint32_t *)&local_248);
    if (sVar9 == SPV_SUCCESS) {
      sVar9 = spvtools::AssemblyContext::binaryEncodeU32(context,(Op)local_248,pInst);
      if (sVar9 == SPV_SUCCESS) {
        spvtools::AssemblyGrammar::pushOperandTypesForMask
                  (grammar,type,(Op)local_248,pExpectedOperands);
        return SPV_SUCCESS;
      }
      return sVar9;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_208,context,sVar9);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Invalid ",8);
    pcVar14 = spvOperandTypeStr(type);
    local_240._0_8_ = pcVar14;
    pDVar15 = spvtools::DiagnosticStream::operator<<
                        ((DiagnosticStream *)local_208,(char **)&local_240);
    pcVar14 = " operand \'";
    lVar16 = 10;
    goto LAB_001820f9;
  case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
    type_00 = (IdType *)&spvtools::kUnknownType;
    goto LAB_001821b5;
  case SPV_OPERAND_TYPE_OPTIONAL_CIV:
    sVar9 = spvTextEncodeOperand
                      (grammar,context,SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER,textValue,pInst,
                       pExpectedOperands);
    if ((sVar9 == SPV_FAILED_MATCH) &&
       (sVar9 = spvTextEncodeOperand
                          (grammar,context,SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,textValue,pInst,
                           pExpectedOperands), sVar9 == SPV_FAILED_MATCH)) {
      sVar9 = spvTextEncodeOperand
                        (grammar,context,SPV_OPERAND_TYPE_FIRST_OPTIONAL_TYPE,textValue,pInst,
                         pExpectedOperands);
    }
    if (sVar9 == SPV_SUCCESS) {
      psVar17 = (pExpectedOperands->
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl
                .super__Vector_impl_data._M_start;
      iVar5._M_current =
           (pExpectedOperands->
           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (psVar17 != iVar5._M_current) {
        return SPV_SUCCESS;
      }
      local_208._0_4_ = 0x32;
      if (psVar17 !=
          (pExpectedOperands->
          super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        *iVar5._M_current = SPV_OPERAND_TYPE_OPTIONAL_CIV;
        (pExpectedOperands->
        super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>)._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        return SPV_SUCCESS;
      }
      std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::
      _M_realloc_insert<spv_operand_type_t>(pExpectedOperands,iVar5,(spv_operand_type_t *)local_208)
      ;
      return SPV_SUCCESS;
    }
    spvtools::AssemblyContext::diagnostic((DiagnosticStream *)local_208,context,sVar9);
    pcVar14 = "Invalid word following !<integer>: ";
    lVar16 = 0x23;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar14,lVar16);
  pDVar15 = spvtools::DiagnosticStream::operator<<((DiagnosticStream *)local_208,&local_250);
  local_38 = pDVar15->error_;
LAB_0018212c:
  spvtools::DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
  return local_38;
}

Assistant:

spv_result_t spvTextEncodeOperand(const spvtools::AssemblyGrammar& grammar,
                                  spvtools::AssemblyContext* context,
                                  const spv_operand_type_t type,
                                  const char* textValue,
                                  spv_instruction_t* pInst,
                                  spv_operand_pattern_t* pExpectedOperands) {
  // NOTE: Handle immediate int in the stream
  if ('!' == textValue[0]) {
    if (auto error = encodeImmediate(context, textValue, pInst)) {
      return error;
    }
    *pExpectedOperands =
        spvAlternatePatternFollowingImmediate(*pExpectedOperands);
    return SPV_SUCCESS;
  }

  // Optional literal operands can fail to parse. In that case use
  // SPV_FAILED_MATCH to avoid emitting a diagostic.  Use the following
  // for those situations.
  spv_result_t error_code_for_literals =
      spvOperandIsOptional(type) ? SPV_FAILED_MATCH : SPV_ERROR_INVALID_TEXT;

  switch (type) {
    case SPV_OPERAND_TYPE_ID:
    case SPV_OPERAND_TYPE_TYPE_ID:
    case SPV_OPERAND_TYPE_RESULT_ID:
    case SPV_OPERAND_TYPE_MEMORY_SEMANTICS_ID:
    case SPV_OPERAND_TYPE_SCOPE_ID:
    case SPV_OPERAND_TYPE_OPTIONAL_ID: {
      if ('%' == textValue[0]) {
        textValue++;
      } else {
        return context->diagnostic() << "Expected id to start with %.";
      }
      if (!spvIsValidID(textValue)) {
        return context->diagnostic() << "Invalid ID " << textValue;
      }
      const uint32_t id = context->spvNamedIdAssignOrGet(textValue);
      if (type == SPV_OPERAND_TYPE_TYPE_ID) pInst->resultTypeId = id;
      spvInstructionAddWord(pInst, id);

      // Set the extended instruction type.
      // The import set id is the 3rd operand of OpExtInst.
      if (spvIsExtendedInstruction(pInst->opcode) && pInst->words.size() == 4) {
        auto ext_inst_type = context->getExtInstTypeForId(pInst->words[3]);
        if (ext_inst_type == SPV_EXT_INST_TYPE_NONE) {
          return context->diagnostic()
                 << "Invalid extended instruction import Id "
                 << pInst->words[2];
        }
        pInst->extInstType = ext_inst_type;
      }
    } break;

    case SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER: {
      // The assembler accepts the symbolic name for an extended instruction,
      // and emits its corresponding number.
      spv_ext_inst_desc extInst;
      if (grammar.lookupExtInst(pInst->extInstType, textValue, &extInst) ==
          SPV_SUCCESS) {
        // if we know about this extended instruction, push the numeric value
        spvInstructionAddWord(pInst, extInst->ext_inst);

        // Prepare to parse the operands for the extended instructions.
        spvPushOperandTypes(extInst->operandTypes, pExpectedOperands);
      } else {
        // if we don't know this extended instruction and the set isn't
        // non-semantic, we cannot process further
        if (!spvExtInstIsNonSemantic(pInst->extInstType)) {
          return context->diagnostic()
                 << "Invalid extended instruction name '" << textValue << "'.";
        } else {
          // for non-semantic instruction sets, as long as the text name is an
          // integer value we can encode it since we know the form of all such
          // extended instructions
          spv_literal_t extInstValue;
          if (spvTextToLiteral(textValue, &extInstValue) ||
              extInstValue.type != SPV_LITERAL_TYPE_UINT_32) {
            return context->diagnostic()
                   << "Couldn't translate unknown extended instruction name '"
                   << textValue << "' to unsigned integer.";
          }

          spvInstructionAddWord(pInst, extInstValue.value.u32);

          // opcode contains an unknown number of IDs.
          pExpectedOperands->push_back(SPV_OPERAND_TYPE_VARIABLE_ID);
        }
      }
    } break;

    case SPV_OPERAND_TYPE_SPEC_CONSTANT_OP_NUMBER: {
      // The assembler accepts the symbolic name for the opcode, but without
      // the "Op" prefix.  For example, "IAdd" is accepted.  The number
      // of the opcode is emitted.
      spv::Op opcode;
      if (grammar.lookupSpecConstantOpcode(textValue, &opcode)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      spv_opcode_desc opcodeEntry = nullptr;
      if (grammar.lookupOpcode(opcode, &opcodeEntry)) {
        return context->diagnostic(SPV_ERROR_INTERNAL)
               << "OpSpecConstant opcode table out of sync";
      }
      spvInstructionAddWord(pInst, uint32_t(opcodeEntry->opcode));

      // Prepare to parse the operands for the opcode.  Except skip the
      // type Id and result Id, since they've already been processed.
      assert(opcodeEntry->hasType);
      assert(opcodeEntry->hasResult);
      assert(opcodeEntry->numTypes >= 2);
      spvPushOperandTypes(opcodeEntry->operandTypes + 2, pExpectedOperands);
    } break;

    case SPV_OPERAND_TYPE_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_INTEGER: {
      // The current operand is an *unsigned* 32-bit integer.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarIntegerType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_FLOAT: {
      // The current operand is a 32-bit float.
      // That's just how the grammar works.
      spvtools::IdType expected_type = {
          32, false, spvtools::IdTypeClass::kScalarFloatType};
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER:
      // This is a context-independent literal number which can be a 32-bit
      // number of floating point value.
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, spvtools::kUnknownType,
              pInst)) {
        return error;
      }
      break;

    case SPV_OPERAND_TYPE_OPTIONAL_TYPED_LITERAL_INTEGER:
    case SPV_OPERAND_TYPE_TYPED_LITERAL_NUMBER: {
      spvtools::IdType expected_type = spvtools::kUnknownType;
      // The encoding for OpConstant, OpSpecConstant and OpSwitch all
      // depend on either their own result-id or the result-id of
      // one of their parameters.
      if (spv::Op::OpConstant == pInst->opcode ||
          spv::Op::OpSpecConstant == pInst->opcode) {
        // The type of the literal is determined by the type Id of the
        // instruction.
        expected_type =
            context->getTypeOfTypeGeneratingValue(pInst->resultTypeId);
        if (!spvtools::isScalarFloating(expected_type) &&
            !spvtools::isScalarIntegral(expected_type)) {
          spv_opcode_desc d;
          const char* opcode_name = "opcode";
          if (SPV_SUCCESS == grammar.lookupOpcode(pInst->opcode, &d)) {
            opcode_name = d->name;
          }
          return context->diagnostic()
                 << "Type for " << opcode_name
                 << " must be a scalar floating point or integer type";
        }
      } else if (pInst->opcode == spv::Op::OpSwitch) {
        // The type of the literal is the same as the type of the selector.
        expected_type = context->getTypeOfValueInstruction(pInst->words[1]);
        if (!spvtools::isScalarIntegral(expected_type)) {
          return context->diagnostic()
                 << "The selector operand for OpSwitch must be the result"
                    " of an instruction that generates an integer scalar";
        }
      }
      if (auto error = context->binaryEncodeNumericLiteral(
              textValue, error_code_for_literals, expected_type, pInst)) {
        return error;
      }
    } break;

    case SPV_OPERAND_TYPE_LITERAL_STRING:
    case SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING: {
      spv_literal_t literal = {};
      spv_result_t error = spvTextToLiteral(textValue, &literal);
      if (error != SPV_SUCCESS) {
        if (error == SPV_ERROR_OUT_OF_MEMORY) return error;
        return context->diagnostic(error_code_for_literals)
               << "Invalid literal string '" << textValue << "'.";
      }
      if (literal.type != SPV_LITERAL_TYPE_STRING) {
        return context->diagnostic()
               << "Expected literal string, found literal number '" << textValue
               << "'.";
      }

      // NOTE: Special case for extended instruction library import
      if (spv::Op::OpExtInstImport == pInst->opcode) {
        const spv_ext_inst_type_t ext_inst_type =
            spvExtInstImportTypeGet(literal.str.c_str());
        if (SPV_EXT_INST_TYPE_NONE == ext_inst_type) {
          return context->diagnostic()
                 << "Invalid extended instruction import '" << literal.str
                 << "'";
        }
        if ((error = context->recordIdAsExtInstImport(pInst->words[1],
                                                      ext_inst_type)))
          return error;
      }

      if (context->binaryEncodeString(literal.str.c_str(), pInst))
        return SPV_ERROR_INVALID_TEXT;
    } break;

    // Masks.
    case SPV_OPERAND_TYPE_FP_FAST_MATH_MODE:
    case SPV_OPERAND_TYPE_FUNCTION_CONTROL:
    case SPV_OPERAND_TYPE_LOOP_CONTROL:
    case SPV_OPERAND_TYPE_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_IMAGE:
    case SPV_OPERAND_TYPE_OPTIONAL_MEMORY_ACCESS:
    case SPV_OPERAND_TYPE_OPTIONAL_RAW_ACCESS_CHAIN_OPERANDS:
    case SPV_OPERAND_TYPE_SELECTION_CONTROL:
    case SPV_OPERAND_TYPE_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_CLDEBUG100_DEBUG_INFO_FLAGS:
    case SPV_OPERAND_TYPE_OPTIONAL_COOPERATIVE_MATRIX_OPERANDS: {
      uint32_t value;
      if (auto error = grammar.parseMaskOperand(type, textValue, &value)) {
        return context->diagnostic(error)
               << "Invalid " << spvOperandTypeStr(type) << " operand '"
               << textValue << "'.";
      }
      if (auto error = context->binaryEncodeU32(value, pInst)) return error;
      // Prepare to parse the operands for this logical operand.
      grammar.pushOperandTypesForMask(type, value, pExpectedOperands);
    } break;
    case SPV_OPERAND_TYPE_OPTIONAL_CIV: {
      auto error = spvTextEncodeOperand(
          grammar, context, SPV_OPERAND_TYPE_OPTIONAL_LITERAL_NUMBER, textValue,
          pInst, pExpectedOperands);
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal number -- is it a literal string?
        error = spvTextEncodeOperand(grammar, context,
                                     SPV_OPERAND_TYPE_OPTIONAL_LITERAL_STRING,
                                     textValue, pInst, pExpectedOperands);
      }
      if (error == SPV_FAILED_MATCH) {
        // It's not a literal -- is it an ID?
        error =
            spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_OPTIONAL_ID,
                                 textValue, pInst, pExpectedOperands);
      }
      if (error) {
        return context->diagnostic(error)
               << "Invalid word following !<integer>: " << textValue;
      }
      if (pExpectedOperands->empty()) {
        pExpectedOperands->push_back(SPV_OPERAND_TYPE_OPTIONAL_CIV);
      }
    } break;
    default: {
      // NOTE: All non literal operands are handled here using the operand
      // table.
      spv_operand_desc entry;
      if (grammar.lookupOperand(type, textValue, strlen(textValue), &entry)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }
      if (context->binaryEncodeU32(entry->value, pInst)) {
        return context->diagnostic() << "Invalid " << spvOperandTypeStr(type)
                                     << " '" << textValue << "'.";
      }

      // Prepare to parse the operands for this logical operand.
      spvPushOperandTypes(entry->operandTypes, pExpectedOperands);
    } break;
  }
  return SPV_SUCCESS;
}